

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

Symbol * slang::ast::anon_unknown_39::unwrapTypeParam(Scope *scope,Symbol *symbol)

{
  bool bVar1;
  Type *in_RSI;
  Compilation *in_RDI;
  Type *result;
  DeclaredType *in_stack_00000050;
  undefined8 in_stack_ffffffffffffffe0;
  undefined1 isLValue;
  Type *local_8;
  
  isLValue = (undefined1)((ulong)in_stack_ffffffffffffffe0 >> 0x38);
  local_8 = in_RSI;
  if ((in_RSI->super_Symbol).kind == TypeParameter) {
    Scope::getCompilation((Scope *)in_RDI);
    Compilation::noteReference(in_RDI,&in_RSI->super_Symbol,(bool)isLValue);
    Symbol::as<slang::ast::TypeParameterSymbol>((Symbol *)0x65966b);
    local_8 = DeclaredType::getType(in_stack_00000050);
    bVar1 = Type::isError((Type *)0x659686);
    if (bVar1) {
      local_8 = (Type *)0x0;
    }
  }
  return &local_8->super_Symbol;
}

Assistant:

const Symbol* unwrapTypeParam(const Scope& scope, const Symbol* symbol) {
    if (symbol->kind == SymbolKind::TypeParameter) {
        scope.getCompilation().noteReference(*symbol);

        auto result = &symbol->as<TypeParameterSymbol>().targetType.getType();
        if (result->isError())
            return nullptr;

        return result;
    }
    return symbol;
}